

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *begin,char *end)

{
  char *pcVar1;
  undefined8 *in_RDI;
  uint in_stack_000001ac;
  char *in_stack_000001b0;
  undefined1 in_stack_ffffffffffffffdb;
  ValueType in_stack_ffffffffffffffdc;
  Value *in_stack_ffffffffffffffe0;
  
  Comments::Comments((Comments *)0x1fb4db);
  initBasic(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(bool)in_stack_ffffffffffffffdb);
  pcVar1 = duplicateAndPrefixStringValue(in_stack_000001b0,in_stack_000001ac);
  *in_RDI = pcVar1;
  return;
}

Assistant:

Value::Value(const char* begin, const char* end) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateAndPrefixStringValue(begin, static_cast<unsigned>(end - begin));
}